

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O1

Room * __thiscall Model<Room>::save(Model<Room> *this)

{
  long lVar1;
  Room *pRVar2;
  pair<int,_Room> local_28;
  
  lVar1 = __dynamic_cast(this,&typeinfo,&Room::typeinfo,0);
  if (lVar1 != 0) {
    local_28.first = this->id;
    local_28.second.super_Model<Room>.id = *(int *)(lVar1 + 8);
    local_28.second.super_Model<Room>._vptr_Model = (_func_int **)&PTR_save_0012e060;
    local_28.second._12_8_ = *(undefined8 *)(lVar1 + 0xc);
    local_28.second._20_2_ = *(undefined2 *)(lVar1 + 0x14);
    std::
    _Rb_tree<int,std::pair<int_const,Room>,std::_Select1st<std::pair<int_const,Room>>,std::less<int>,std::allocator<std::pair<int_const,Room>>>
    ::_M_emplace_unique<std::pair<int,Room>>
              ((_Rb_tree<int,std::pair<int_const,Room>,std::_Select1st<std::pair<int_const,Room>>,std::less<int>,std::allocator<std::pair<int_const,Room>>>
                *)&objectList,&local_28);
    pRVar2 = (Room *)__dynamic_cast(this,&typeinfo,&Room::typeinfo,0);
    if (pRVar2 != (Room *)0x0) {
      return pRVar2;
    }
  }
  __cxa_bad_cast();
}

Assistant:

T &Model<T>::save() {
    Model<T>::objectList.insert(pair<int, T>(this->id, dynamic_cast<T &> (*this)));
    return dynamic_cast<T &> (*this);
}